

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerReflection::emit_type
          (CompilerReflection *this,uint32_t type_id,bool *emitted_open_tag)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type_00;
  element_type *peVar3;
  size_t sVar4;
  uint local_23c;
  uint32_t i;
  size_t size;
  string local_228 [32];
  ID local_208;
  allocator local_201;
  string local_200 [32];
  __cxx11 local_1e0 [32];
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  __cxx11 local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  __cxx11 local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [8];
  string name;
  SPIRType *type;
  bool *emitted_open_tag_local;
  uint32_t type_id_local;
  CompilerReflection *this_local;
  
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_48,this,type_00,0);
  if ((*emitted_open_tag & 1U) == 0) {
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"types",&local_69);
    simple_json::Stream::emit_json_key_object(peVar3,(string *)local_68);
    ::std::__cxx11::string::~string(local_68);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    *emitted_open_tag = true;
  }
  peVar3 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  ::std::__cxx11::to_string(local_c0,type_id);
  ::std::operator+((char *)local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40fecd);
  simple_json::Stream::emit_json_key_object(peVar3,local_a0);
  ::std::__cxx11::string::~string((string *)local_a0);
  ::std::__cxx11::string::~string((string *)local_c0);
  peVar3 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e0,"name",&local_e1);
  simple_json::Stream::emit_json_key_value(peVar3,(string *)local_e0,local_48);
  ::std::__cxx11::string::~string(local_e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = Compiler::is_physical_pointer((Compiler *)this,type_00);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_108,"type",&local_109);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->parent_type);
    ::std::__cxx11::to_string(local_150,uVar2);
    ::std::operator+((char *)local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40fecd);
    simple_json::Stream::emit_json_key_value(peVar3,(string *)local_108,local_130);
    ::std::__cxx11::string::~string((string *)local_130);
    ::std::__cxx11::string::~string((string *)local_150);
    ::std::__cxx11::string::~string(local_108);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_170,"physical_pointer",&local_171);
    simple_json::Stream::emit_json_key_value(peVar3,(string *)local_170,true);
    ::std::__cxx11::string::~string(local_170);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  else {
    bVar1 = VectorView<unsigned_int>::empty(&(type_00->array).super_VectorView<unsigned_int>);
    if (bVar1) {
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_228,"members",(allocator *)((long)&size + 7));
      simple_json::Stream::emit_json_key_array(peVar3,(string *)local_228);
      ::std::__cxx11::string::~string(local_228);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
      sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(type_00->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      for (local_23c = 0; local_23c < sVar4; local_23c = local_23c + 1) {
        emit_type_member(this,type_00,local_23c);
      }
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::end_json_array(peVar3);
    }
    else {
      emit_type_array(this,type_00);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_198,"type",&local_199);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->parent_type);
      ::std::__cxx11::to_string(local_1e0,uVar2);
      ::std::operator+((char *)local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40fecd
                      );
      simple_json::Stream::emit_json_key_value(peVar3,(string *)local_198,local_1c0);
      ::std::__cxx11::string::~string((string *)local_1c0);
      ::std::__cxx11::string::~string((string *)local_1e0);
      ::std::__cxx11::string::~string(local_198);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_200,"array_stride",&local_201);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_208,type_id);
      uVar2 = Compiler::get_decoration((Compiler *)this,local_208,DecorationArrayStride);
      simple_json::Stream::emit_json_key_value(peVar3,(string *)local_200,uVar2);
      ::std::__cxx11::string::~string(local_200);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
    }
  }
  peVar3 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::end_json_object(peVar3);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerReflection::emit_type(uint32_t type_id, bool &emitted_open_tag)
{
	auto &type = get<SPIRType>(type_id);
	auto name = type_to_glsl(type);

	if (!emitted_open_tag)
	{
		json_stream->emit_json_key_object("types");
		emitted_open_tag = true;
	}
	json_stream->emit_json_key_object("_" + std::to_string(type_id));
	json_stream->emit_json_key_value("name", name);

	if (is_physical_pointer(type))
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(type.parent_type));
		json_stream->emit_json_key_value("physical_pointer", true);
	}
	else if (!type.array.empty())
	{
		emit_type_array(type);
		json_stream->emit_json_key_value("type", "_" + std::to_string(type.parent_type));
		json_stream->emit_json_key_value("array_stride", get_decoration(type_id, DecorationArrayStride));
	}
	else
	{
		json_stream->emit_json_key_array("members");
		// FIXME ideally we'd like to emit the size of a structure as a
		// convenience to people parsing the reflected JSON.  The problem
		// is that there's no implicit size for a type.  It's final size
		// will be determined by the top level declaration in which it's
		// included.  So there might be one size for the struct if it's
		// included in a std140 uniform block and another if it's included
		// in a std430 uniform block.
		// The solution is to include *all* potential sizes as a map of
		// layout type name to integer, but that will probably require
		// some additional logic being written in this class, or in the
		// parent CompilerGLSL class.
		auto size = type.member_types.size();
		for (uint32_t i = 0; i < size; ++i)
		{
			emit_type_member(type, i);
		}
		json_stream->end_json_array();
	}

	json_stream->end_json_object();
}